

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_substring(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val;
  JSValue val_00;
  JSValue JVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long in_R8;
  JSValue JVar5;
  JSString *p;
  int end;
  int start;
  int b;
  int a;
  JSValue ret;
  JSValue str;
  JSContext *in_stack_ffffffffffffff70;
  JSValueUnion JVar6;
  JSValueUnion in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  JSValueUnion JVar7;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar9;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  JSValueUnion in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  int min_offset;
  undefined4 uStack_3c;
  int32_t local_10;
  int iStack_c;
  JSValueUnion local_8;
  
  iVar4 = iStack_c;
  JVar5.tag = in_stack_ffffffffffffff80;
  JVar5.u.ptr = in_stack_ffffffffffffff78.ptr;
  JVar5 = JS_ToStringCheckObject(in_stack_ffffffffffffff70,JVar5);
  JVar6 = JVar5.u;
  min_offset = (int)JVar5.tag;
  uStack_3c = JVar5.tag._4_4_;
  JVar7 = JVar6;
  iVar2 = JS_IsException(JVar5);
  local_10 = JVar5.u._0_4_;
  iStack_c = JVar5.u._4_4_;
  if (iVar2 == 0) {
    val.tag = in_stack_ffffffffffffffb0;
    val.u.ptr = in_stack_ffffffffffffffa8.ptr;
    iVar2 = JS_ToInt32Clamp((JSContext *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),val
                            ,iStack_c,local_10,min_offset);
    iStack_c = iVar4;
    if (iVar2 == 0) {
      uVar3 = (uint)*(undefined8 *)((long)JVar6.ptr + 4) & 0x7fffffff;
      iVar4 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x10));
      if ((iVar4 == 0) &&
         (val_00.tag = in_stack_ffffffffffffffb0, val_00.u.ptr = in_stack_ffffffffffffffa8.ptr,
         iVar4 = JS_ToInt32Clamp((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),
                                 (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ),val_00,JVar6._4_4_,JVar6.int32,min_offset),
         iVar4 != 0)) {
        v_00.tag = (int64_t)JVar7.ptr;
        v_00.u.ptr = in_stack_ffffffffffffff78.ptr;
        JS_FreeValue(in_stack_ffffffffffffff70,v_00);
        local_10 = 0;
        local_8.float64 = 2.96439387504748e-323;
      }
      else {
        uVar8 = in_stack_ffffffffffffffa4;
        uVar9 = uVar3;
        if ((int)in_stack_ffffffffffffffa4 < (int)uVar3) {
          uVar8 = uVar3;
          uVar9 = in_stack_ffffffffffffffa4;
        }
        JVar5 = js_sub_string((JSContext *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),
                              (JSString *)CONCAT44(uVar9,uVar8),JVar6._4_4_,JVar6.int32);
        JVar6 = JVar5.u;
        local_8 = (JSValueUnion)JVar5.tag;
        v_01.tag = (int64_t)JVar7.ptr;
        v_01.u.ptr = local_8.ptr;
        JS_FreeValue((JSContext *)JVar6.ptr,v_01);
        local_10 = JVar6.int32;
        iStack_c = JVar6._4_4_;
      }
    }
    else {
      v.tag = (int64_t)JVar7.ptr;
      v.u.ptr = in_stack_ffffffffffffff78.ptr;
      JS_FreeValue(in_stack_ffffffffffffff70,v);
      local_10 = 0;
      local_8.float64 = 2.96439387504748e-323;
    }
  }
  else {
    local_8._4_4_ = uStack_3c;
    local_8.int32 = min_offset;
  }
  JVar1.u._4_4_ = iStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

static JSValue js_string_substring(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int a, b, start, end;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    if (JS_ToInt32Clamp(ctx, &a, argv[0], 0, p->len, 0)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    b = p->len;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &b, argv[1], 0, p->len, 0)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    if (a < b) {
        start = a;
        end = b;
    } else {
        start = b;
        end = a;
    }
    ret = js_sub_string(ctx, p, start, end);
    JS_FreeValue(ctx, str);
    return ret;
}